

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O2

void bhdct_setup_string_key
               (planck_unit_test_t *tc,ion_dictionary_handler_t *handler,ion_dictionary_t *dict,
               ion_behaviour_fill_level_e fill_level)

{
  uint uVar1;
  int iVar2;
  char key [9];
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  bhdct_master_table_init(tc);
  (*bhdct_context.init_fcn)(handler);
  bhdct_dictionary_initialization
            (tc,handler,dict,key_type_null_terminated_string,7,4,bhdct_context.dictionary_size);
  key[0] = '\0';
  key[1] = '\0';
  key[2] = '\0';
  key[3] = '\0';
  key[4] = '\0';
  key[5] = '\0';
  key[6] = '\0';
  key[7] = '\0';
  key[8] = '\0';
  switch(fill_level) {
  case ion_fill_edge_cases:
    iVar2 = -300;
    for (uVar1 = 0xffffff9c; (int)uVar1 < -0x32; uVar1 = uVar1 + 2) {
      sprintf(key,"k%d",(ulong)uVar1);
      local_34 = iVar2;
      bhdct_insert(tc,dict,key,&local_34,'\x01');
      iVar2 = iVar2 + 6;
    }
  case ion_fill_high:
    iVar2 = 5000;
    for (uVar1 = 500; uVar1 < 1000; uVar1 = uVar1 + 5) {
      sprintf(key,"k%d",(ulong)uVar1);
      local_38 = iVar2;
      bhdct_insert(tc,dict,key,&local_38,'\x01');
      iVar2 = iVar2 + 0x32;
    }
  case ion_fill_medium:
    iVar2 = 0xfa;
    for (uVar1 = 0x32; uVar1 < 100; uVar1 = uVar1 + 2) {
      sprintf(key,"k%d",(ulong)uVar1);
      local_3c = iVar2;
      bhdct_insert(tc,dict,key,&local_3c,'\x01');
      iVar2 = iVar2 + 10;
    }
  case ion_fill_low:
    iVar2 = 0;
    for (uVar1 = 0; uVar1 != 10; uVar1 = uVar1 + 1) {
      sprintf(key,"k%d",(ulong)uVar1);
      local_40 = iVar2;
      bhdct_insert(tc,dict,key,&local_40,'\x01');
      iVar2 = iVar2 + 2;
    }
    return;
  default:
    return;
  }
}

Assistant:

void
bhdct_setup_string_key(
	planck_unit_test_t			*tc,
	ion_dictionary_handler_t	*handler,
	ion_dictionary_t			*dict,
	ion_behaviour_fill_level_e	fill_level
) {
	bhdct_master_table_init(tc);
	bhdct_context.init_fcn(handler);
	/* Note most of these are fixed except the dictionary size */
	bhdct_dictionary_initialization(tc, handler, dict, key_type_null_terminated_string, 7, sizeof(int), bhdct_context.dictionary_size);

	char key[ION_BHDCT_STRING_KEY_BUFFER_SIZE] = { 0 };

	/* This switch statement intentionally doesn't have breaks - we want it to fall through. */
	int i;

	switch (fill_level) {
		case ion_fill_edge_cases: {
			ION_FILL_EDGE_LOOP(i) {
				sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, i);
				bhdct_insert(tc, dict, key, ION_EDGE_VALUE(i), boolean_true);
			}
		}

		case ion_fill_high: {
			ION_FILL_HIGH_LOOP(i) {
				sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, i);
				bhdct_insert(tc, dict, key, ION_HIGH_VALUE(i), boolean_true);
			}
		}

		case ion_fill_medium: {
			ION_FILL_MEDIUM_LOOP(i) {
				sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, i);
				bhdct_insert(tc, dict, key, ION_MEDIUM_VALUE(i), boolean_true);
			}
		}

		case ion_fill_low: {
			ION_FILL_LOW_LOOP(i) {
				sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, i);
				bhdct_insert(tc, dict, key, ION_LOW_VALUE(i), boolean_true);
			}
		}

		case ion_fill_none: {
			/* Intentionally left blank */
		}
	}
}